

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitvector_tests.cpp
# Opt level: O3

void bsim::print_float_bits(float f)

{
  char local_28;
  undefined7 uStack_27;
  long local_20;
  undefined1 local_18 [16];
  
  float_bit_string_abi_cxx11_(0.0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)CONCAT71(uStack_27,local_28),local_20);
  if ((undefined1 *)CONCAT71(uStack_27,local_28) != local_18) {
    operator_delete((undefined1 *)CONCAT71(uStack_27,local_28));
  }
  local_28 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_28,1);
  return;
}

Assistant:

void print_float_bits(float f) {
    cout << float_bit_string(f);

    std::cout << '\n';
  }